

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddReportBlock
          (RTCPCompoundPacketBuilder *this,uint32_t ssrc,uint8_t fractionlost,int32_t packetslost,
          uint32_t exthighestseq,uint32_t jitter,uint32_t lsr,uint32_t dlsr)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  value_type local_40;
  
  if (this->arebuilding == true) {
    if ((this->report).headerlength == 0) {
      iVar3 = -0x2c;
    }
    else {
      sVar1 = this->appsize;
      sVar2 = this->byesize;
      sVar4 = SDES::NeededBytes(&this->sdes);
      sVar5 = Report::NeededBytesWithExtraReportBlock(&this->report);
      if (this->maximumpacketsize < sVar5 + sVar4 + sVar1 + sVar2) {
        iVar3 = -0x2b;
      }
      else {
        local_40.packetdata =
             (uint8_t *)
             operator_new__(0x18,(this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,0x12);
        if ((uint *)local_40.packetdata == (uint *)0x0) {
          iVar3 = -1;
        }
        else {
          *(uint32_t *)local_40.packetdata =
               ssrc >> 0x18 | (ssrc & 0xff0000) >> 8 | (ssrc & 0xff00) << 8 | ssrc << 0x18;
          *(uint8_t *)((long)local_40.packetdata + 4) = fractionlost;
          *(char *)((long)local_40.packetdata + 7) = (char)packetslost;
          *(char *)((long)local_40.packetdata + 6) = (char)((uint)packetslost >> 8);
          *(char *)((long)local_40.packetdata + 5) = (char)((uint)packetslost >> 0x10);
          *(uint32_t *)((long)local_40.packetdata + 8) =
               exthighestseq >> 0x18 | (exthighestseq & 0xff0000) >> 8 |
               (exthighestseq & 0xff00) << 8 | exthighestseq << 0x18;
          *(uint32_t *)((long)local_40.packetdata + 0xc) =
               jitter >> 0x18 | (jitter & 0xff0000) >> 8 | (jitter & 0xff00) << 8 | jitter << 0x18;
          *(uint32_t *)((long)local_40.packetdata + 0x10) =
               lsr >> 0x18 | (lsr & 0xff0000) >> 8 | (lsr & 0xff00) << 8 | lsr << 0x18;
          *(uint32_t *)((long)local_40.packetdata + 0x14) =
               dlsr >> 0x18 | (dlsr & 0xff0000) >> 8 | (dlsr & 0xff00) << 8 | dlsr << 0x18;
          local_40.packetlength = 0x18;
          std::__cxx11::
          list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
          ::push_back(&(this->report).reportblocks,&local_40);
          iVar3 = 0;
        }
      }
    }
    return iVar3;
  }
  return -0x2a;
}

Assistant:

int RTCPCompoundPacketBuilder::AddReportBlock(uint32_t ssrc,uint8_t fractionlost,int32_t packetslost,uint32_t exthighestseq,
	                                      uint32_t jitter,uint32_t lsr,uint32_t dlsr)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength == 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_REPORTNOTSTARTED;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalothersize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalothersize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t reportsizewithextrablock = report.NeededBytesWithExtraReportBlock();
	
	if ((totalothersize+reportsizewithextrablock) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRECEIVERREPORT) uint8_t[sizeof(RTCPReceiverReport)];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	
	RTCPReceiverReport *rr = (RTCPReceiverReport *)buf;
	uint32_t *packlost = (uint32_t *)&packetslost;
	uint32_t packlost2 = (*packlost);
		
	rr->ssrc = htonl(ssrc);
	rr->fractionlost = fractionlost;
	rr->packetslost[2] = (uint8_t)(packlost2&0xFF);
	rr->packetslost[1] = (uint8_t)((packlost2>>8)&0xFF);
	rr->packetslost[0] = (uint8_t)((packlost2>>16)&0xFF);
	rr->exthighseqnr = htonl(exthighestseq);
	rr->jitter = htonl(jitter);
	rr->lsr = htonl(lsr);
	rr->dlsr = htonl(dlsr);

	report.reportblocks.push_back(Buffer(buf,sizeof(RTCPReceiverReport)));
	return 0;
}